

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PointTest.cpp
# Opt level: O2

void __thiscall PointRetractation::test_method(PointRetractation *this)

{
  Matrix<double,_3,_1,_0,_3,_1> local_398;
  RealScalar local_378;
  undefined1 local_370;
  undefined8 local_368;
  shared_count sStack_360;
  undefined **local_358;
  undefined1 local_350;
  undefined8 *local_348;
  char **local_340;
  Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_> local_330;
  char *local_318;
  char *local_310;
  char *local_308;
  char *local_300;
  undefined1 *local_2f8;
  undefined1 *local_2f0;
  char *local_2e8;
  char *local_2e0;
  RealSpace R3;
  Point y;
  Point x;
  
  mnf::RealSpace::RealSpace(&R3,3);
  local_398.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] =
       1.0;
  local_398.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1] =
       2.0;
  local_398.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] =
       3.0;
  mnf::Manifold::getZero();
  Eigen::Ref<Eigen::Matrix<double,-1,1,0,-1,1>const,0,Eigen::InnerStride<1>>::
  Ref<Eigen::Matrix<double,3,1,0,3,1>>
            ((Ref<Eigen::Matrix<double,_1,1,0,_1,1>const,0,Eigen::InnerStride<1>> *)&local_358,
             (DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)&local_398,(type *)0x0);
  mnf::Point::retractation((Ref *)&y);
  free(local_340);
  local_2e8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/stanislas-brossette[P]manifolds/tests/PointTest.cpp"
  ;
  local_2e0 = "";
  local_2f8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2f0 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_2e8,0x41);
  mnf::SubPoint::value();
  local_378 = 1e-12;
  local_370 = Eigen::internal::
              isApprox_selector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::Ref<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::InnerStride<1>_>,_false>
              ::run(&local_398,&local_330,&local_378);
  local_368 = 0;
  sStack_360.pi_ = (sp_counted_base *)0x0;
  local_340 = &local_308;
  local_308 = "v.isApprox(y.value())";
  local_300 = "";
  local_350 = 0;
  local_358 = &PTR__lazy_ostream_0013ec40;
  local_348 = &boost::unit_test::lazy_ostream::inst;
  local_318 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/stanislas-brossette[P]manifolds/tests/PointTest.cpp"
  ;
  local_310 = "";
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_360);
  mnf::Point::~Point(&y);
  mnf::Point::~Point(&x);
  mnf::RealSpace::~RealSpace(&R3);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(PointRetractation)
{
  RealSpace R3(3);
  Eigen::Vector3d v(1, 2, 3);
  Point x = R3.getZero();
  Point y = x.retractation(v);
  BOOST_CHECK(v.isApprox(y.value()));
}